

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O0

void sbfQueue_destroy(sbfQueue queue)

{
  long in_RDI;
  sbfQueueCb in_stack_00000008;
  sbfQueue in_stack_00000010;
  
  sbfLog_log(*(undefined8 *)(in_RDI + 8),0,"destroying queue %p",in_RDI);
  sbfHiResTimer_queueDestroy(in_stack_00000010);
  sbfQueue_addRef((sbfQueue)0x1045a3);
  sbfQueue_enqueue(in_stack_00000010,in_stack_00000008,queue);
  *(undefined4 *)(in_RDI + 0x1c) = 1;
  sbfQueue_removeRef((sbfQueue)0x1045c7);
  return;
}

Assistant:

void
sbfQueue_destroy (sbfQueue queue)
{
    sbfLog_debug (queue->mLog, "destroying queue %p", queue);

    sbfHiResTimer_queueDestroy (queue);

    sbfQueue_addRef (queue);
    sbfQueue_enqueue (queue, NULL, NULL);
    queue->mExited = 1;

    sbfQueue_removeRef (queue);
}